

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int nni_pipe_alloc_dialer(void **datap,nni_dialer *d)

{
  int iVar1;
  nni_pipe *in_RAX;
  nni_pipe *local_18;
  nni_pipe *p;
  
  local_18 = in_RAX;
  iVar1 = pipe_create(&local_18,d->d_sock,d->d_tran,d,(nni_listener *)0x0);
  if (iVar1 == 0) {
    *datap = local_18->p_tran_data;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_pipe_alloc_dialer(void **datap, nni_dialer *d)
{
	int          rv;
	nni_sp_tran *tran = d->d_tran;
	nni_sock    *s    = d->d_sock;
	nni_pipe    *p;

	if ((rv = pipe_create(&p, s, tran, d, NULL)) != 0) {
		return (rv);
	}
	*datap = p->p_tran_data;
	return (0);
}